

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# claim_strategy_test.cc
# Opt level: O2

void disruptor::test::SingleThreadedStrategy::IncrementAndGet_invoker(void)

{
  undefined8 uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  char *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  basic_wrap_stringstream<char> local_420;
  pointer local_288;
  pointer local_280;
  pointer local_278;
  pointer local_270;
  pointer local_268;
  pointer local_260;
  pointer local_258;
  pointer local_250;
  pointer local_248;
  pointer local_240;
  IncrementAndGet t;
  
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_430 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/claim_strategy_test.cc"
  ;
  local_428 = "";
  memset((basic_wrap_stringstream<char> *)&t,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream((basic_wrap_stringstream<char> *)&t)
  ;
  std::operator<<((ostream *)&t,'\"');
  std::operator<<((ostream *)&t,"IncrementAndGet");
  std::operator<<((ostream *)&t,"\" fixture ctor");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_((basic_wrap_stringstream<char> *)&t)
  ;
  local_248 = (pbVar2->_M_dataplus)._M_p;
  local_240 = local_248 + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_430,0x3f);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream
            ((basic_wrap_stringstream<char> *)&t);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  t.super_BOOST_AUTO_TEST_CASE_FIXTURE.cursor.sequence_.super___atomic_base<long>._M_i =
       (__atomic_base<long>)-1;
  t.super_BOOST_AUTO_TEST_CASE_FIXTURE.sequence_1.sequence_.super___atomic_base<long>._M_i =
       (__atomic_base<long>)-1;
  t.super_BOOST_AUTO_TEST_CASE_FIXTURE.sequence_2.sequence_.super___atomic_base<long>._M_i =
       (__atomic_base<long>)-1;
  t.super_BOOST_AUTO_TEST_CASE_FIXTURE.sequence_3.sequence_.super___atomic_base<long>._M_i =
       (__atomic_base<long>)-1;
  t.super_BOOST_AUTO_TEST_CASE_FIXTURE.empty_dependents.
  super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  t.super_BOOST_AUTO_TEST_CASE_FIXTURE.empty_dependents.
  super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  t.super_BOOST_AUTO_TEST_CASE_FIXTURE.empty_dependents.
  super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  t.super_BOOST_AUTO_TEST_CASE_FIXTURE.strategy.buffer_size_ = 8;
  t.super_BOOST_AUTO_TEST_CASE_FIXTURE.strategy.last_claimed_sequence_._0_4_ = 0xffffffff;
  t.super_BOOST_AUTO_TEST_CASE_FIXTURE.strategy.last_claimed_sequence_._4_4_ = 0xffffffff;
  t.super_BOOST_AUTO_TEST_CASE_FIXTURE.strategy.last_consumer_sequence_._0_4_ = 0xffffffff;
  t.super_BOOST_AUTO_TEST_CASE_FIXTURE.strategy.last_consumer_sequence_._4_4_ = 0xffffffff;
  local_440 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/claim_strategy_test.cc"
  ;
  local_438 = "";
  memset(&local_420,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_420);
  std::operator<<((ostream *)&local_420,'\"');
  std::operator<<((ostream *)&local_420,"IncrementAndGet");
  std::operator<<((ostream *)&local_420,"\" fixture setup");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_420);
  local_258 = (pbVar2->_M_dataplus)._M_p;
  local_250 = local_258 + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_440,0x3f);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_420);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_450 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/claim_strategy_test.cc"
  ;
  local_448 = "";
  memset(&local_420,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_420);
  std::operator<<((ostream *)&local_420,'\"');
  std::operator<<((ostream *)&local_420,"IncrementAndGet");
  std::operator<<((ostream *)&local_420,"\" test entry");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_420);
  local_268 = (pbVar2->_M_dataplus)._M_p;
  local_260 = local_268 + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_450,0x3f);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_420);
  IncrementAndGet::test_method(&t);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_460 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/claim_strategy_test.cc"
  ;
  local_458 = "";
  memset(&local_420,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_420);
  std::operator<<((ostream *)&local_420,'\"');
  std::operator<<((ostream *)&local_420,"IncrementAndGet");
  std::operator<<((ostream *)&local_420,"\" fixture teardown");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_420);
  local_278 = (pbVar2->_M_dataplus)._M_p;
  local_270 = local_278 + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_460,0x3f);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_420);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_470 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/claim_strategy_test.cc"
  ;
  local_468 = "";
  memset(&local_420,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_420);
  std::operator<<((ostream *)&local_420,'\"');
  std::operator<<((ostream *)&local_420,"IncrementAndGet");
  std::operator<<((ostream *)&local_420,"\" fixture dtor");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_420);
  local_288 = (pbVar2->_M_dataplus)._M_p;
  local_280 = local_288 + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_470,0x3f);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_420);
  std::_Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>::~_Vector_base
            (&t.super_BOOST_AUTO_TEST_CASE_FIXTURE.empty_dependents.
              super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(IncrementAndGet) {
  int64_t return_value = strategy.IncrementAndGet(cursor, empty_dependents);
  BOOST_CHECK_EQUAL(return_value, kFirstSequenceValue);

  const size_t delta = 10;
  return_value = strategy.IncrementAndGet(cursor, empty_dependents, delta);
  BOOST_CHECK_EQUAL(return_value, kFirstSequenceValue + delta);
}